

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O0

void __thiscall
insert_duplicated_vertices<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>::test_method
          (insert_duplicated_vertices<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
           *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  lazy_ostream *plVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  basic_cstring<const_char> local_da0;
  basic_cstring<const_char> local_d90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d80;
  assertion_result local_d60;
  basic_cstring<const_char> local_d48;
  basic_cstring<const_char> local_d38;
  basic_cstring<const_char> local_d28;
  basic_cstring<const_char> local_d18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d08;
  assertion_result local_ce8;
  basic_cstring<const_char> local_cd0;
  basic_cstring<const_char> local_cc0;
  basic_cstring<const_char> local_cb0;
  basic_cstring<const_char> local_ca0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c90;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_c70;
  assertion_result local_c68;
  basic_cstring<const_char> local_c50;
  basic_cstring<const_char> local_c40;
  basic_cstring<const_char> local_c30;
  basic_cstring<const_char> local_c20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c10;
  assertion_result local_bf0;
  basic_cstring<const_char> local_bd8;
  basic_cstring<const_char> local_bc8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_bb8 [2];
  undefined8 local_ba8;
  undefined4 local_ba0;
  undefined4 local_b9c;
  undefined4 local_b98;
  undefined4 local_b94;
  undefined4 *local_b90;
  undefined8 local_b88;
  undefined1 local_b80 [32];
  basic_cstring<const_char> local_b60;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b50;
  assertion_result local_b30;
  basic_cstring<const_char> local_b18;
  basic_cstring<const_char> local_b08;
  basic_cstring<const_char> local_af8;
  basic_cstring<const_char> local_ae8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_ad8;
  assertion_result local_ab8;
  basic_cstring<const_char> local_aa0;
  basic_cstring<const_char> local_a90;
  basic_cstring<const_char> local_a80;
  basic_cstring<const_char> local_a70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a60;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_a40;
  assertion_result local_a38;
  basic_cstring<const_char> local_a20;
  basic_cstring<const_char> local_a10;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_a00;
  basic_cstring<const_char> local_9f8;
  basic_cstring<const_char> local_9e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9d8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_9b8;
  assertion_result local_9b0;
  basic_cstring<const_char> local_998;
  basic_cstring<const_char> local_988;
  basic_cstring<const_char> local_978;
  basic_cstring<const_char> local_968;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_958;
  assertion_result local_938;
  basic_cstring<const_char> local_920;
  basic_cstring<const_char> local_910;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_900 [2];
  undefined8 local_8f0;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 *local_8d8;
  undefined8 local_8d0;
  undefined1 local_8c8 [32];
  basic_cstring<const_char> local_8a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_898;
  assertion_result local_878;
  basic_cstring<const_char> local_860;
  basic_cstring<const_char> local_850;
  basic_cstring<const_char> local_840;
  basic_cstring<const_char> local_830;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_820;
  assertion_result local_800;
  basic_cstring<const_char> local_7e8;
  basic_cstring<const_char> local_7d8;
  basic_cstring<const_char> local_7c8;
  basic_cstring<const_char> local_7b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7a8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_788;
  assertion_result local_780;
  basic_cstring<const_char> local_768;
  basic_cstring<const_char> local_758;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_748;
  basic_cstring<const_char> local_740;
  basic_cstring<const_char> local_730;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_720;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_700;
  assertion_result local_6f8;
  basic_cstring<const_char> local_6e0;
  basic_cstring<const_char> local_6d0;
  basic_cstring<const_char> local_6c0;
  basic_cstring<const_char> local_6b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6a0;
  assertion_result local_680;
  basic_cstring<const_char> local_668;
  basic_cstring<const_char> local_658;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_648 [2];
  undefined8 local_638;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  undefined4 local_624;
  undefined4 *local_620;
  undefined8 local_618;
  undefined1 local_610 [32];
  basic_cstring<const_char> local_5f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_5e0;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_5c0;
  assertion_result local_5b8;
  basic_cstring<const_char> local_5a0;
  basic_cstring<const_char> local_590;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_580;
  basic_cstring<const_char> local_578;
  basic_cstring<const_char> local_568;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_558;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_538;
  assertion_result local_530;
  basic_cstring<const_char> local_518;
  basic_cstring<const_char> local_508;
  basic_cstring<const_char> local_4f8;
  basic_cstring<const_char> local_4e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4d8;
  assertion_result local_4b8;
  basic_cstring<const_char> local_4a0;
  basic_cstring<const_char> local_490;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_480 [2];
  undefined8 local_470;
  undefined4 local_464;
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 *local_458;
  undefined8 local_450;
  undefined1 local_448 [32];
  basic_cstring<const_char> local_428;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_418;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_3f8;
  assertion_result local_3f0;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_3b8;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_390;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_370;
  assertion_result local_368;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  basic_cstring<const_char> local_320;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_310;
  assertion_result local_2f0;
  basic_cstring<const_char> local_2d8;
  basic_cstring<const_char> local_2c8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_2b8 [2];
  undefined8 local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 *local_298;
  undefined8 local_290;
  undefined1 local_288 [32];
  basic_cstring<const_char> local_268;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_258;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_238;
  assertion_result local_230;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_1f8;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1d0;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_1b0;
  assertion_result local_1a8;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_150;
  assertion_result local_130;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_f8 [4];
  undefined8 local_d8;
  undefined4 local_cc;
  undefined4 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [24];
  bool success;
  Simplex_handle sh;
  Simplex_tree<Gudhi::Simplex_tree_options_default> st;
  insert_duplicated_vertices<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_> *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::clog,"TEST INSERT DUPLICATED VERTICES");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)&stack0xffffffffffffff60);
  local_b8[0x17] = 0;
  local_cc = 1;
  local_c8 = &local_cc;
  local_c0 = 1;
  local_d8 = 0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (initializer_list<int> *)&sh,(Filtration_value *)&local_c8);
  std::
  tie<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>
            (local_f8,(bool *)&stack0xffffffffffffff60);
  std::
  tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
  ::operator=((tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
               *)local_f8,
              (pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_b8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_108,0x3c8,&local_118);
    boost::test_tools::assertion_result::assertion_result(&local_130,(bool)(local_b8[0x17] & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,"success",7);
    boost::unit_test::operator<<(&local_150,plVar5,&local_160);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_130,&local_150,&local_170,0x3c8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_150);
    boost::test_tools::assertion_result::~assertion_result(&local_130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_190);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_180,0x3c9,&local_190);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::null_simplex();
    bVar2 = boost::container::operator!=
                      ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                        *)&stack0xffffffffffffff60,&local_1b0);
    boost::test_tools::assertion_result::assertion_result(&local_1a8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,"sh != st.null_simplex()",0x17);
    boost::unit_test::operator<<(&local_1d0,plVar5,&local_1e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_1a8,&local_1d0,&local_1f0,0x3c9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1d0);
    boost::test_tools::assertion_result::~assertion_result(&local_1a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator(&local_1f8,
                 (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)&stack0xffffffffffffff60);
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_1f8);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_218);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_208,0x3cb,&local_218);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_238,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                    *)&stack0xffffffffffffff60);
    iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_238);
    boost::test_tools::assertion_result::assertion_result(&local_230,iVar3 == 0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,"st.dimension(sh) == 0",0x15);
    boost::unit_test::operator<<(&local_258,plVar5,&local_268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_288 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_230,&local_258,local_288 + 0x10,0x3cb,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_258);
    boost::test_tools::assertion_result::~assertion_result(&local_230);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_2a0 = 2;
  local_29c = 2;
  local_298 = &local_2a0;
  local_290 = 2;
  local_2a8 = 0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_288,
             (initializer_list<int> *)&sh,(Filtration_value *)&local_298);
  std::
  tie<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>
            (local_2b8,(bool *)&stack0xffffffffffffff60);
  std::
  tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
  ::operator=((tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
               *)local_2b8,
              (pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_288);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2c8,0x3cd,&local_2d8);
    boost::test_tools::assertion_result::assertion_result(&local_2f0,(bool)(local_b8[0x17] & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_320,"success",7);
    boost::unit_test::operator<<(&local_310,plVar5,&local_320);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_2f0,&local_310,&local_330,0x3cd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_310);
    boost::test_tools::assertion_result::~assertion_result(&local_2f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_350);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_340,0x3ce,&local_350);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::null_simplex();
    bVar2 = boost::container::operator!=
                      ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                        *)&stack0xffffffffffffff60,&local_370);
    boost::test_tools::assertion_result::assertion_result(&local_368,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a0,"sh != st.null_simplex()",0x17);
    boost::unit_test::operator<<(&local_390,plVar5,&local_3a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_368,&local_390,&local_3b0,0x3ce,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_390);
    boost::test_tools::assertion_result::~assertion_result(&local_368);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator(&local_3b8,
                 (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)&stack0xffffffffffffff60);
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_3b8);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3c8,0x3d0,&local_3d8);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_3f8,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                    *)&stack0xffffffffffffff60);
    iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_3f8);
    boost::test_tools::assertion_result::assertion_result(&local_3f0,iVar3 == 0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,"st.dimension(sh) == 0",0x15);
    boost::unit_test::operator<<(&local_418,plVar5,&local_428);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_448 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_3f0,&local_418,local_448 + 0x10,0x3d0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_418);
    boost::test_tools::assertion_result::~assertion_result(&local_3f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_464 = 3;
  local_460 = 3;
  local_45c = 3;
  local_458 = &local_464;
  local_450 = 3;
  local_470 = 0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_448,
             (initializer_list<int> *)&sh,(Filtration_value *)&local_458);
  std::
  tie<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>
            (local_480,(bool *)&stack0xffffffffffffff60);
  std::
  tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
  ::operator=((tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
               *)local_480,
              (pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_448);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_490,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_490,0x3d2,&local_4a0);
    boost::test_tools::assertion_result::assertion_result(&local_4b8,(bool)(local_b8[0x17] & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e8,"success",7);
    boost::unit_test::operator<<(&local_4d8,plVar5,&local_4e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_4b8,&local_4d8,&local_4f8,0x3d2,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4d8);
    boost::test_tools::assertion_result::~assertion_result(&local_4b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_518);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_508,0x3d3,&local_518);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::null_simplex();
    bVar2 = boost::container::operator!=
                      ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                        *)&stack0xffffffffffffff60,&local_538);
    boost::test_tools::assertion_result::assertion_result(&local_530,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_568,"sh != st.null_simplex()",0x17);
    boost::unit_test::operator<<(&local_558,plVar5,&local_568);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_578,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_530,&local_558,&local_578,0x3d3,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_558);
    boost::test_tools::assertion_result::~assertion_result(&local_530);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator(&local_580,
                 (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)&stack0xffffffffffffff60);
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_580);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_590,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_590,0x3d5,&local_5a0);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_5c0,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                    *)&stack0xffffffffffffff60);
    iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_5c0);
    boost::test_tools::assertion_result::assertion_result(&local_5b8,iVar3 == 0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5f0,"st.dimension(sh) == 0",0x15);
    boost::unit_test::operator<<(&local_5e0,plVar5,&local_5f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_610 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_5b8,&local_5e0,local_610 + 0x10,0x3d5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_5e0);
    boost::test_tools::assertion_result::~assertion_result(&local_5b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_630 = 4;
  local_62c = 4;
  local_628 = 4;
  local_624 = 4;
  local_620 = &local_630;
  local_618 = 4;
  local_638 = 0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_610,
             (initializer_list<int> *)&sh,(Filtration_value *)&local_620);
  std::
  tie<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>
            (local_648,(bool *)&stack0xffffffffffffff60);
  std::
  tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
  ::operator=((tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
               *)local_648,
              (pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_610);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_668);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_658,0x3d7,&local_668);
    boost::test_tools::assertion_result::assertion_result(&local_680,(bool)(local_b8[0x17] & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6b0,"success",7);
    boost::unit_test::operator<<(&local_6a0,plVar5,&local_6b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_680,&local_6a0,&local_6c0,0x3d7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6a0);
    boost::test_tools::assertion_result::~assertion_result(&local_680);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6d0,0x3d8,&local_6e0);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::null_simplex();
    bVar2 = boost::container::operator!=
                      ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                        *)&stack0xffffffffffffff60,&local_700);
    boost::test_tools::assertion_result::assertion_result(&local_6f8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_730,"sh != st.null_simplex()",0x17);
    boost::unit_test::operator<<(&local_720,plVar5,&local_730);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_740,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_6f8,&local_720,&local_740,0x3d8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_720);
    boost::test_tools::assertion_result::~assertion_result(&local_6f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator(&local_748,
                 (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)&stack0xffffffffffffff60);
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_748);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_758,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_768);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_758,0x3da,&local_768);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_788,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                    *)&stack0xffffffffffffff60);
    iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_788);
    boost::test_tools::assertion_result::assertion_result(&local_780,iVar3 == 0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7b8,"st.dimension(sh) == 0",0x15);
    boost::unit_test::operator<<(&local_7a8,plVar5,&local_7b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_780,&local_7a8,&local_7c8,0x3da,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7a8);
    boost::test_tools::assertion_result::~assertion_result(&local_780);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar4 = std::operator<<((ostream *)&std::clog,"dimension =");
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4," - num_vertices = ");
  sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar7);
  poVar4 = std::operator<<(poVar4," - num_simplices = ");
  sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar7);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7d8,0x3de,&local_7e8);
    iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
    boost::test_tools::assertion_result::assertion_result(&local_800,iVar3 == 0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_830,"st.dimension() == 0",0x13);
    boost::unit_test::operator<<(&local_820,plVar5,&local_830);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_840,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_800,&local_820,&local_840,0x3de,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_820);
    boost::test_tools::assertion_result::~assertion_result(&local_800);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_850,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_860);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_850,0x3df,&local_860);
    sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
    sVar8 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
    boost::test_tools::assertion_result::assertion_result(&local_878,sVar7 == sVar8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8a8,"st.num_simplices() == st.num_vertices()",0x27);
    boost::unit_test::operator<<(&local_898,plVar5,&local_8a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_8c8 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_878,&local_898,local_8c8 + 0x10,0x3df,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_898);
    boost::test_tools::assertion_result::~assertion_result(&local_878);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_8e8 = 2;
  local_8e4 = 1;
  local_8e0 = 1;
  local_8dc = 2;
  local_8d8 = &local_8e8;
  local_8d0 = 4;
  local_8f0 = 0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_8c8,
             (initializer_list<int> *)&sh,(Filtration_value *)&local_8d8);
  std::
  tie<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>
            (local_900,(bool *)&stack0xffffffffffffff60);
  std::
  tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
  ::operator=((tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
               *)local_900,
              (pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_8c8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_910,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_920);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_910,0x3e2,&local_920);
    boost::test_tools::assertion_result::assertion_result(&local_938,(bool)(local_b8[0x17] & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_968,"success",7);
    boost::unit_test::operator<<(&local_958,plVar5,&local_968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_978,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_938,&local_958,&local_978,0x3e2,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_958);
    boost::test_tools::assertion_result::~assertion_result(&local_938);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_988,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_998);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_988,0x3e3,&local_998);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::null_simplex();
    bVar2 = boost::container::operator!=
                      ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                        *)&stack0xffffffffffffff60,&local_9b8);
    boost::test_tools::assertion_result::assertion_result(&local_9b0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e8,"sh != st.null_simplex()",0x17);
    boost::unit_test::operator<<(&local_9d8,plVar5,&local_9e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_9b0,&local_9d8,&local_9f8,0x3e3,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9d8);
    boost::test_tools::assertion_result::~assertion_result(&local_9b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator(&local_a00,
                 (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)&stack0xffffffffffffff60);
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_a00);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a10,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a20);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a10,0x3e5,&local_a20);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_a40,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                    *)&stack0xffffffffffffff60);
    iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,&local_a40);
    boost::test_tools::assertion_result::assertion_result(&local_a38,iVar3 == 1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a70,"st.dimension(sh) == 1",0x15);
    boost::unit_test::operator<<(&local_a60,plVar5,&local_a70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_a38,&local_a60,&local_a80,0x3e5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a60);
    boost::test_tools::assertion_result::~assertion_result(&local_a38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar4 = std::operator<<((ostream *)&std::clog,"dimension =");
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4," - num_vertices = ");
  sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar7);
  poVar4 = std::operator<<(poVar4," - num_simplices = ");
  sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar7);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_aa0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a90,0x3e9,&local_aa0);
    iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
    boost::test_tools::assertion_result::assertion_result(&local_ab8,iVar3 == 1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ae8,"st.dimension() == 1",0x13);
    boost::unit_test::operator<<(&local_ad8,plVar5,&local_ae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_af8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_ab8,&local_ad8,&local_af8,0x3e9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_ad8);
    boost::test_tools::assertion_result::~assertion_result(&local_ab8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b18);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b08,0x3ea,&local_b18);
    sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
    sVar8 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
    boost::test_tools::assertion_result::assertion_result(&local_b30,sVar7 == sVar8 + 1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b60,"st.num_simplices() == st.num_vertices() + 1",0x2b);
    boost::unit_test::operator<<(&local_b50,plVar5,&local_b60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_b80 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_b30,&local_b50,local_b80 + 0x10,0x3ea,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b50);
    boost::test_tools::assertion_result::~assertion_result(&local_b30);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_ba0 = 1;
  local_b9c = 2;
  local_b98 = 2;
  local_b94 = 1;
  local_b90 = &local_ba0;
  local_b88 = 4;
  local_ba8 = 0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b80,
             (initializer_list<int> *)&sh,(Filtration_value *)&local_b90);
  std::
  tie<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>
            (local_bb8,(bool *)&stack0xffffffffffffff60);
  std::
  tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
  ::operator=((tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>&,bool&>
               *)local_bb8,
              (pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_b80);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bc8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bd8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bc8,0x3ee,&local_bd8);
    boost::test_tools::assertion_result::assertion_result(&local_bf0,(bool)(~local_b8[0x17] & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c20,"!success",8);
    boost::unit_test::operator<<(&local_c10,plVar5,&local_c20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_bf0,&local_c10,&local_c30,0x3ee,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c10);
    boost::test_tools::assertion_result::~assertion_result(&local_bf0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c40,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c40,0x3ef,&local_c50);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::null_simplex();
    bVar2 = boost::container::operator==
                      ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                        *)&stack0xffffffffffffff60,&local_c70);
    boost::test_tools::assertion_result::assertion_result(&local_c68,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ca0,"sh == st.null_simplex()",0x17);
    boost::unit_test::operator<<(&local_c90,plVar5,&local_ca0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cb0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_c68,&local_c90,&local_cb0,0x3ef,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c90);
    boost::test_tools::assertion_result::~assertion_result(&local_c68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar4 = std::operator<<((ostream *)&std::clog,"dimension =");
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4," - num_vertices = ");
  sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar7);
  poVar4 = std::operator<<(poVar4," - num_simplices = ");
  sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar7);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_cc0,0x3f3,&local_cd0);
    iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
    boost::test_tools::assertion_result::assertion_result(&local_ce8,iVar3 == 1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d18,"st.dimension() == 1",0x13);
    boost::unit_test::operator<<(&local_d08,plVar5,&local_d18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_ce8,&local_d08,&local_d28,0x3f3,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d08);
    boost::test_tools::assertion_result::~assertion_result(&local_ce8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d38,0x3f4,&local_d48);
    sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
    sVar8 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
    boost::test_tools::assertion_result::assertion_result(&local_d60,sVar7 == sVar8 + 1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d90,"st.num_simplices() == st.num_vertices() + 1",0x2b);
    boost::unit_test::operator<<(&local_d80,plVar5,&local_d90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_da0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_d60,&local_d80,&local_da0,0x3f4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d80);
    boost::test_tools::assertion_result::~assertion_result(&local_d60);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(insert_duplicated_vertices, typeST, list_of_tested_variants) {
  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST INSERT DUPLICATED VERTICES" << std::endl;
  typeST st;

  typename typeST::Simplex_handle sh;
  bool success = false;
  std::tie(sh, success) = st.insert_simplex_and_subfaces({1});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 0);
  std::tie(sh, success) = st.insert_simplex_and_subfaces({2, 2});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 0);
  std::tie(sh, success) = st.insert_simplex_and_subfaces({3, 3, 3});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 0);
  std::tie(sh, success) = st.insert_simplex_and_subfaces({4, 4, 4, 4});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 0);

  std::clog << "dimension =" << st.dimension() << " - num_vertices = " << st.num_vertices()
            << " - num_simplices = " << st.num_simplices() << std::endl;
  BOOST_CHECK(st.dimension() == 0);
  BOOST_CHECK(st.num_simplices() == st.num_vertices());

  std::tie(sh, success) = st.insert_simplex_and_subfaces({2, 1, 1, 2});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 1);

  std::clog << "dimension =" << st.dimension() << " - num_vertices = " << st.num_vertices()
            << " - num_simplices = " << st.num_simplices() << std::endl;
  BOOST_CHECK(st.dimension() == 1);
  BOOST_CHECK(st.num_simplices() == st.num_vertices() + 1);

  // Already inserted
  std::tie(sh, success) = st.insert_simplex_and_subfaces({1, 2, 2, 1});
  BOOST_CHECK(!success);
  BOOST_CHECK(sh == st.null_simplex());

  std::clog << "dimension =" << st.dimension() << " - num_vertices = " << st.num_vertices()
            << " - num_simplices = " << st.num_simplices() << std::endl;
  BOOST_CHECK(st.dimension() == 1);
  BOOST_CHECK(st.num_simplices() == st.num_vertices() + 1);
}